

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

Value * __thiscall
cmFileAPI::BuildCache(Value *__return_storage_ptr__,cmFileAPI *this,Object *object)

{
  char *value;
  Value *this_00;
  Value local_90;
  Value *local_68;
  Value *version;
  Value local_50;
  undefined1 local_21;
  Object *local_20;
  Object *object_local;
  cmFileAPI *this_local;
  Value *cache;
  
  local_21 = 0;
  local_20 = object;
  object_local = (Object *)this;
  this_local = (cmFileAPI *)__return_storage_ptr__;
  cmFileAPICacheDump(__return_storage_ptr__,this,object->Version);
  value = ObjectKindName(local_20->Kind);
  Json::Value::Value(&local_50,value);
  this_00 = Json::Value::operator[](__return_storage_ptr__,"kind");
  Json::Value::operator=(this_00,&local_50);
  Json::Value::~Value(&local_50);
  local_68 = Json::Value::operator[](__return_storage_ptr__,"version");
  if (local_20->Version == 2) {
    BuildVersion(&local_90,2,0);
    Json::Value::operator=(local_68,&local_90);
    Json::Value::~Value(&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildCache(Object const& object)
{
  using namespace std::placeholders;
  Json::Value cache = cmFileAPICacheDump(*this, object.Version);
  cache["kind"] = this->ObjectKindName(object.Kind);

  Json::Value& version = cache["version"];
  if (object.Version == 2) {
    version = BuildVersion(2, CacheV2Minor);
  } else {
    return cache; // should be unreachable
  }

  return cache;
}